

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

int fy_emit_document(fy_emitter *emit,fy_document *fyd)

{
  int rc;
  fy_document *fyd_local;
  fy_emitter *emit_local;
  
  emit_local._4_4_ = fy_emit_document_start(emit,fyd,(fy_node *)0x0);
  if ((emit_local._4_4_ == 0) &&
     (emit_local._4_4_ = fy_emit_root_node(emit,fyd->root), emit_local._4_4_ == 0)) {
    emit_local._4_4_ = fy_emit_document_end(emit);
  }
  return emit_local._4_4_;
}

Assistant:

int fy_emit_document(struct fy_emitter *emit, struct fy_document *fyd) {
    int rc;

    rc = fy_emit_document_start(emit, fyd, NULL);
    if (rc)
        return rc;

    rc = fy_emit_root_node(emit, fyd->root);
    if (rc)
        return rc;

    rc = fy_emit_document_end(emit);

    return rc;
}